

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.h
# Opt level: O3

void __thiscall Net::Conv(Net *this)

{
  Matrix<float,_3,_3,_0,_3,_3> *pMVar1;
  undefined8 uVar2;
  Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1> *pMVar3;
  Matrix<float,_50,_26,_0,_50,_26> *pMVar4;
  long lVar5;
  long lVar6;
  Scalar SVar7;
  MatrixXf cur2;
  MatrixXf cur3;
  MatrixXf cur1;
  scalar_sum_op<float,_float> local_e9;
  DenseStorage<float,__1,__1,__1,_0> local_e8;
  Matrix<float,_50,_26,_0,_50,_26> *local_d0;
  Matrix<float,__1,__1,_0,__1,__1> local_c8;
  Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false> local_b0;
  Matrix<float,__1,__1,_0,__1,__1> local_78;
  Matrix<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_8,_1,_0,_8,_1> *local_58;
  long local_50;
  Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1> *local_48;
  Matrix<float,_50,_26,_0,_50,_26> *local_40;
  Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1> *local_38;
  
  local_78.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (float *)0x0;
  local_78.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  lVar6 = 0;
  local_78.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_e8.m_cols = 0;
  local_e8.m_data = (float *)0x0;
  local_e8.m_rows = 0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (float *)0x0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_58 = &this->convKernel;
  local_d0 = &this->pad;
  pMVar3 = &this->convData;
  do {
    if ((local_e8.m_rows != 3) || (local_e8.m_cols != 3)) {
      Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize(&local_e8,9,3,3);
      if ((local_e8.m_rows != 3) || (local_e8.m_cols != 3)) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/AssignEvaluator.h"
                      ,0x2d1,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, -1>, SrcXprType = Eigen::Matrix<float, 3, 3>, T1 = float, T2 = float]"
                     );
      }
    }
    pMVar1 = (local_58->
             super_PlainObjectBase<Eigen::Matrix<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_8,_1,_0,_8,_1>_>
             ).m_storage.m_data.array + lVar6;
    uVar2 = *(undefined8 *)
             ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage
                     .m_data + 8);
    *(undefined8 *)local_e8.m_data =
         *(undefined8 *)
          &(pMVar1->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data;
    *(undefined8 *)(local_e8.m_data + 2) = uVar2;
    uVar2 = *(undefined8 *)
             ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage
                     .m_data + 0x18);
    *(undefined8 *)(local_e8.m_data + 4) =
         *(undefined8 *)
          ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data + 0x10);
    *(undefined8 *)(local_e8.m_data + 6) = uVar2;
    local_e8.m_data[8] =
         *(float *)((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data + 0x20);
    lVar5 = 0;
    pMVar4 = local_d0;
    local_50 = lVar6;
    local_48 = pMVar3;
    do {
      lVar6 = 0;
      local_40 = pMVar4;
      local_38 = pMVar3;
      do {
        local_b0.
        super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_0>.
        m_rows.m_value = 3;
        local_b0.
        super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_0>.
        m_cols.m_value = 3;
        local_b0.
        super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.m_xpr =
             local_d0;
        local_b0.
        super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
        m_outerStride = 0x32;
        local_b0.
        super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_0>.
        m_data = (PointerType)pMVar4;
        local_b0.
        super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
        m_startRow.m_value = lVar5;
        local_b0.
        super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
        m_startCol.m_value = lVar6;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<float,50,26,0,50,26>,_1,_1,false>,Eigen::internal::assign_op<float,float>>
                  (&local_78,&local_b0,(assign_op<float,_float> *)&local_e9);
        local_b0.
        super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_0>.
        m_rows.m_value = (long)&local_e8;
        local_b0.
        super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_0>.
        m_data = (PointerType)&local_78;
        if ((local_78.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows != local_e8.m_rows) ||
           (local_78.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != local_e8.m_cols)) {
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/CwiseBinaryOp.h"
                        ,0x6e,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::ArrayWrapper<Eigen::Matrix<float, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<float, -1, -1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::ArrayWrapper<Eigen::Matrix<float, -1, -1>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<float, -1, -1>>]"
                       );
        }
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,_1,0,_1,_1>>const,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,_1,0,_1,_1>>const>,Eigen::internal::assign_op<float,float>>
                  (&local_c8,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                    *)&local_b0,(assign_op<float,_float> *)&local_e9);
        if (local_c8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols == 0 ||
            (DenseStorage<float,__1,__1,__1,_0> *)
            local_c8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows == (DenseStorage<float,__1,__1,__1,_0> *)0x0) {
          SVar7 = 0.0;
        }
        else {
          if ((local_c8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows < 1) ||
             (local_c8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols < 1)) {
            __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/Redux.h"
                          ,0x19d,
                          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<float, -1, -1>>::redux(const Func &) const [Derived = Eigen::Matrix<float, -1, -1>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
                         );
          }
          local_b0.
          super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_0>.
          m_data = local_c8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
          local_b0.
          super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_0>.
          m_rows.m_value =
               local_c8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
          local_b0.
          super_BlockImpl<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false>,_0>.
          m_cols.m_value = (long)&local_c8;
          SVar7 = Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<float,_float>,_Eigen::internal::redux_evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_3,_0>
                  ::run((redux_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&local_b0,
                        &local_e9);
        }
        (pMVar3->
        super_PlainObjectBase<Eigen::Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1>_>
        ).m_storage.m_data.array[0].super_PlainObjectBase<Eigen::Matrix<float,_48,_24,_0,_48,_24>_>.
        m_storage.m_data.array[0] = SVar7;
        lVar6 = lVar6 + 1;
        pMVar4 = (Matrix<float,_50,_26,_0,_50,_26> *)
                 ((pMVar4->super_PlainObjectBase<Eigen::Matrix<float,_50,_26,_0,_50,_26>_>).
                  m_storage.m_data.array + 0x32);
        pMVar3 = (Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1> *)
                 ((long)&(pMVar3->
                         super_PlainObjectBase<Eigen::Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1>_>
                         ).m_storage.m_data.array[0].
                         super_PlainObjectBase<Eigen::Matrix<float,_48,_24,_0,_48,_24>_>.m_storage.
                         m_data + 0xc0);
      } while (lVar6 != 0x16);
      lVar5 = lVar5 + 1;
      pMVar4 = (Matrix<float,_50,_26,_0,_50,_26> *)
               ((local_40->super_PlainObjectBase<Eigen::Matrix<float,_50,_26,_0,_50,_26>_>).
                m_storage.m_data.array + 1);
      pMVar3 = (Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1> *)
               ((long)&(local_38->
                       super_PlainObjectBase<Eigen::Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1>_>
                       ).m_storage.m_data.array[0].
                       super_PlainObjectBase<Eigen::Matrix<float,_48,_24,_0,_48,_24>_>.m_storage.
                       m_data + 4);
    } while (lVar5 != 0x2e);
    lVar6 = local_50 + 1;
    pMVar3 = (Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1> *)
             ((local_48->
              super_PlainObjectBase<Eigen::Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1>_>
              ).m_storage.m_data.array + 1);
    if (lVar6 == 8) {
      free(local_c8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
          );
      free(local_e8.m_data);
      free(local_78.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
          );
      return;
    }
  } while( true );
}

Assistant:

void Net::Conv()
{
    MatrixXf cur1,cur2,cur3;

    for(int k = 0 ;k < CONV_CHANNEL; k++)
    {
        cur2 = convKernel(k,0);
        for(int i = 0; i <= BLOCK_HEIGHT - CONVKS; i++)
        {
            for(int j = 0; j <= BLOCK_WIDTH  - CONVKS; j++)
            {
                if(i < 0 || j < 0)
                    assert("Conv Error!");
                cur1 = pad.block(i,j,CONVKS,CONVKS);
                cur3 = cur1.array()*cur2.array();
                //FUCK YOU EIGEN
                (convData(k,0))(i,j) = cur3.sum();

                //To-Do::Added offset activation function

            }
        }
    }
}